

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

void __thiscall llvm::APInt::lshrInPlace(APInt *this,uint ShiftAmt)

{
  bool bVar1;
  uint ShiftAmt_local;
  APInt *this_local;
  
  if (ShiftAmt <= this->BitWidth) {
    bVar1 = isSingleWord(this);
    if (bVar1) {
      if (ShiftAmt == this->BitWidth) {
        (this->U).VAL = 0;
      }
      else {
        (this->U).VAL = (this->U).VAL >> ((byte)ShiftAmt & 0x3f);
      }
    }
    else {
      lshrSlowCase(this,ShiftAmt);
    }
    return;
  }
  __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x3d2,"void llvm::APInt::lshrInPlace(unsigned int)");
}

Assistant:

void lshrInPlace(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      if (ShiftAmt == BitWidth)
        U.VAL = 0;
      else
        U.VAL >>= ShiftAmt;
      return;
    }
    lshrSlowCase(ShiftAmt);
  }